

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5SegIterClear(Fts5SegIter *pIter)

{
  void *in_RDI;
  
  sqlite3Fts5BufferFree((Fts5Buffer *)0x26b752);
  fts5DataRelease((Fts5Data *)0x26b75f);
  fts5DataRelease((Fts5Data *)0x26b76c);
  fts5TombstoneArrayDelete((Fts5TombstoneArray *)pIter);
  fts5DlidxIterFree((Fts5DlidxIter *)pIter);
  sqlite3_free((void *)0x26b793);
  memset(in_RDI,0,0x80);
  return;
}

Assistant:

static void fts5SegIterClear(Fts5SegIter *pIter){
  fts5BufferFree(&pIter->term);
  fts5DataRelease(pIter->pLeaf);
  fts5DataRelease(pIter->pNextLeaf);
  fts5TombstoneArrayDelete(pIter->pTombArray);
  fts5DlidxIterFree(pIter->pDlidx);
  sqlite3_free(pIter->aRowidOffset);
  memset(pIter, 0, sizeof(Fts5SegIter));
}